

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Amap_ManProduceNetwork(Abc_Ntk_t *pNtk,Vec_Ptr_t *vMapping)

{
  int i;
  Mio_Library_t *pLib;
  undefined8 *puVar1;
  Mio_Gate_t *pMVar2;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin;
  int i_00;
  Mio_Library_t *pMVar3;
  long lVar4;
  int iVar5;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  for (iVar5 = 0; iVar5 < vMapping->nSize; iVar5 = iVar5 + 1) {
    puVar1 = (undefined8 *)Vec_PtrEntry(vMapping,iVar5);
    if (((char *)*puVar1 != (char *)0x0) &&
       (pMVar3 = pLib, pMVar2 = Mio_LibraryReadGateByName(pLib,(char *)*puVar1,(char *)0x0),
       pMVar2 == (Mio_Gate_t *)0x0)) {
      Abc_Print((int)pMVar3,"Current library does not contain gate \"%s\".\n",*puVar1);
      return (Abc_Ntk_t *)0x0;
    }
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_MAP);
  pNtk_00->pManFunc = pLib;
  p = Vec_PtrAlloc(vMapping->nSize);
  iVar5 = 0;
  i = 0;
  for (i_00 = 0; i_00 < vMapping->nSize; i_00 = i_00 + 1) {
    puVar1 = (undefined8 *)Vec_PtrEntry(vMapping,i_00);
    if (*(short *)(puVar1 + 1) == 1) {
      pObj = Abc_NtkCo(pNtk_00,i);
      i = i + 1;
    }
    else if (*(short *)(puVar1 + 1) == -1) {
      pObj = Abc_NtkCi(pNtk_00,iVar5);
      iVar5 = iVar5 + 1;
    }
    else {
      pObj = Abc_NtkCreateNode(pNtk_00);
      pMVar2 = Mio_LibraryReadGateByName(pLib,(char *)*puVar1,(char *)0x0);
      (pObj->field_5).pData = pMVar2;
    }
    for (lVar4 = 0; lVar4 < *(short *)((long)puVar1 + 10); lVar4 = lVar4 + 1) {
      pFanin = (Abc_Obj_t *)Vec_PtrEntry(p,*(int *)((long)puVar1 + lVar4 * 4 + 0xc));
      Abc_ObjAddFanin(pObj,pFanin);
    }
    Vec_PtrPush(p,pObj);
  }
  Vec_PtrFree(p);
  if (iVar5 == pNtk_00->vCis->nSize) {
    if (i == pNtk_00->vCos->nSize) {
      Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
      return pNtk_00;
    }
    __assert_fail("iPos == Abc_NtkCoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDar.c"
                  ,0x118e,"Abc_Ntk_t *Amap_ManProduceNetwork(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  __assert_fail("iPis == Abc_NtkCiNum(pNtkNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDar.c"
                ,0x118d,"Abc_Ntk_t *Amap_ManProduceNetwork(Abc_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Amap_ManProduceNetwork( Abc_Ntk_t * pNtk, Vec_Ptr_t * vMapping )
{
//    extern void * Abc_FrameReadLibGen();
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Amap_Out_t * pRes;
    Vec_Ptr_t * vNodesNew;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNodeNew, * pFaninNew;
    int i, k, iPis, iPos, nDupGates;
    // make sure gates exist in the current library
    Vec_PtrForEachEntry( Amap_Out_t *, vMapping, pRes, i )
        if ( pRes->pName && Mio_LibraryReadGateByName( pLib, pRes->pName, NULL ) == NULL )
        {
            Abc_Print( 1, "Current library does not contain gate \"%s\".\n", pRes->pName );
            return NULL;
        }
    // create the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_MAP );
    pNtkNew->pManFunc = pLib;
    iPis = iPos = 0;
    vNodesNew = Vec_PtrAlloc( Vec_PtrSize(vMapping) );
    Vec_PtrForEachEntry( Amap_Out_t *, vMapping, pRes, i )
    {
        if ( pRes->Type == -1 )
            pNodeNew = Abc_NtkCi( pNtkNew, iPis++ );
        else if ( pRes->Type == 1 )
            pNodeNew = Abc_NtkCo( pNtkNew, iPos++ );
        else
        {
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Mio_LibraryReadGateByName( pLib, pRes->pName, NULL );
        }
        for ( k = 0; k < pRes->nFans; k++ )
        {
            pFaninNew = (Abc_Obj_t *)Vec_PtrEntry( vNodesNew, pRes->pFans[k] );
            Abc_ObjAddFanin( pNodeNew, pFaninNew );
        }
        Vec_PtrPush( vNodesNew, pNodeNew );
    }
    Vec_PtrFree( vNodesNew );
    assert( iPis == Abc_NtkCiNum(pNtkNew) );
    assert( iPos == Abc_NtkCoNum(pNtkNew) );
    // decouple the PO driver nodes to reduce the number of levels
    nDupGates = Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
//    if ( nDupGates && Map_ManReadVerbose(pMan) )
//        Abc_Print( 1, "Duplicated %d gates to decouple the CO drivers.\n", nDupGates );
    return pNtkNew;
}